

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectors.h
# Opt level: O0

void __thiscall Vector<float>::Vector(Vector<float> *this)

{
  Vector<float> *this_local;
  
  this->num_elts = 0;
  this->ptr_to_data = (float *)0x0;
  return;
}

Assistant:

inline Vector< T >::Vector() : num_elts(0), ptr_to_data((T*)0)
// default constructor
{
#ifdef DEBUG
	std::cerr << "Vector<>::Vector()               |default constructor|";
#endif

#ifdef DEBUG
    fprintf(stderr," adr =  %x \n", ptr_to_data);
#endif
}